

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::GeometryShader_gl_in_ArrayLengthTest
          (GeometryShader_gl_in_ArrayLengthTest *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShader_gl_in_ArrayLengthTest_0210fc60;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tests).
  super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::_M_initialize_map(&(this->m_tests).
                       super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
                      ,0);
  this->m_buffer_object_id = 0;
  this->m_vertex_array_object_id = 0;
  return;
}

Assistant:

GeometryShader_gl_in_ArrayLengthTest::GeometryShader_gl_in_ArrayLengthTest(Context&				context,
																		   const ExtParameters& extParams,
																		   const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description), m_buffer_object_id(0), m_vertex_array_object_id(0)
{
	/* Nothing to be done here */
}